

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O0

MDD make_random_ldd_set(int depth,int maxvalue,int elements)

{
  long lVar1;
  uint32_t *values;
  MDD MVar2;
  int high;
  uint32_t uVar3;
  size_t count;
  undefined8 uStack_50;
  uint32_t auStack_48 [2];
  uint32_t *local_40;
  int local_38;
  int local_34;
  int j;
  int i;
  MDD result;
  unsigned_long __vla_expr0;
  int local_14;
  int local_10;
  int elements_local;
  int maxvalue_local;
  int depth_local;
  
  __vla_expr0 = (unsigned_long)auStack_48;
  result = (MDD)(uint)depth;
  lVar1 = -(result * 4 + 0xf & 0xfffffffffffffff0);
  local_40 = (uint32_t *)((long)auStack_48 + lVar1);
  _j = 0;
  local_14 = elements;
  local_10 = maxvalue;
  elements_local = depth;
  for (local_34 = 0; MVar2 = _j, local_34 < local_14; local_34 = local_34 + 1) {
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1048c8;
    lddmc_refs_push(MVar2);
    for (local_38 = 0; high = local_10, MVar2 = _j, values = local_40, local_38 < elements_local;
        local_38 = local_38 + 1) {
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1048e1;
      uVar3 = rng(0,high);
      local_40[local_38] = uVar3;
    }
    count = (size_t)elements_local;
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x10490a;
    _j = lddmc_union_cube(MVar2,values,count);
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x104918;
    lddmc_refs_pop(1);
  }
  return _j;
}

Assistant:

static MDD
make_random_ldd_set(int depth, int maxvalue, int elements)
{
    uint32_t values[depth];
    MDD result = mtbdd_false; // empty set
    for (int i=0; i<elements; i++) {
        lddmc_refs_push(result);
        for (int j=0; j<depth; j++) {
            values[j] = rng(0, maxvalue);
        }
        result = lddmc_union_cube(result, values, depth);
        lddmc_refs_pop(1);
    }
    return result;
}